

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildMaybeResource(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  
  if (value->type_ == 3) {
    bVar1 = buildResource(this,(value->u_).string_,clazz);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: resource in class=\'",0x1a);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                      (clazz->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' is not a JSON string..",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeResource(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: resource in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildResource(value.get<std::string>(), clazz);
}